

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFindLibraryCommand.cxx
# Opt level: O3

string * __thiscall
cmFindLibraryCommand::FindNormalLibraryNamesPerDir_abi_cxx11_
          (string *__return_storage_ptr__,cmFindLibraryCommand *this)

{
  pointer pbVar1;
  Name *pNVar2;
  bool bVar3;
  Name *i;
  Name *name;
  string *n;
  pointer pbVar4;
  cmFindLibraryHelper helper;
  cmFindLibraryHelper local_110;
  
  cmFindLibraryHelper::cmFindLibraryHelper
            (&local_110,(this->super_cmFindBase).super_cmFindCommon.super_cmCommand.Makefile);
  pbVar4 = (this->super_cmFindBase).Names.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pbVar1 = (this->super_cmFindBase).Names.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (pbVar4 != pbVar1) {
    do {
      cmFindLibraryHelper::AddName(&local_110,pbVar4);
      pbVar4 = pbVar4 + 1;
    } while (pbVar4 != pbVar1);
  }
  pbVar4 = (this->super_cmFindBase).super_cmFindCommon.SearchPaths.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pbVar1 = (this->super_cmFindBase).super_cmFindCommon.SearchPaths.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (pbVar4 != pbVar1) {
    name = local_110.Names.
           super__Vector_base<cmFindLibraryHelper::Name,_std::allocator<cmFindLibraryHelper::Name>_>
           ._M_impl.super__Vector_impl_data._M_start;
    pNVar2 = local_110.Names.
             super__Vector_base<cmFindLibraryHelper::Name,_std::allocator<cmFindLibraryHelper::Name>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    do {
      for (; name != pNVar2; name = name + 1) {
        bVar3 = cmFindLibraryHelper::CheckDirectoryForName(&local_110,pbVar4,name);
        if (bVar3) {
          (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)__return_storage_ptr__,local_110.BestPath._M_dataplus._M_p,
                     local_110.BestPath._M_dataplus._M_p + local_110.BestPath._M_string_length);
          goto LAB_00207391;
        }
      }
      pbVar4 = pbVar4 + 1;
      name = local_110.Names.
             super__Vector_base<cmFindLibraryHelper::Name,_std::allocator<cmFindLibraryHelper::Name>_>
             ._M_impl.super__Vector_impl_data._M_start;
      pNVar2 = local_110.Names.
               super__Vector_base<cmFindLibraryHelper::Name,_std::allocator<cmFindLibraryHelper::Name>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    } while (pbVar4 != pbVar1);
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
LAB_00207391:
  cmFindLibraryHelper::~cmFindLibraryHelper(&local_110);
  return __return_storage_ptr__;
}

Assistant:

std::string cmFindLibraryCommand::FindNormalLibraryNamesPerDir()
{
  // Search for all names in each directory.
  cmFindLibraryHelper helper(this->Makefile);
  for (std::string const& n : this->Names) {
    helper.AddName(n);
  }
  // Search every directory.
  for (std::string const& sp : this->SearchPaths) {
    if (helper.CheckDirectory(sp)) {
      return helper.BestPath;
    }
  }
  // Couldn't find the library.
  return "";
}